

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O0

void __thiscall helics::InputInfo::removeSource(InputInfo *this,string_view sourceName,Time minTime)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  size_type sVar2;
  reference this_00;
  reference pvVar3;
  baseType in_RCX;
  char *in_RDX;
  size_t in_RSI;
  vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_> *in_RDI;
  __sv_type __y;
  size_t ii;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  size_t sVar4;
  char *pcVar5;
  ulong local_28;
  TimeRepresentation<count_time<9,_long>_> local_18;
  size_t local_10;
  char *local_8;
  
  local_18.internalTimeCode = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDX;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x50bc1e);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x50bc2f);
  for (local_28 = 0;
      sVar2 = std::
              vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
              ::size((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                      *)&in_RDI[9].
                         super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                         ._M_impl.super__Vector_impl_data._M_finish), local_28 < sVar2;
      local_28 = local_28 + 1) {
    sVar4 = local_10;
    pcVar5 = local_8;
    std::
    vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
    ::operator[]((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                  *)&in_RDI[9].
                     super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                     ._M_impl.super__Vector_impl_data._M_finish,local_28);
    __y = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    __x._M_str = pcVar5;
    __x._M_len = sVar4;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) {
      while( true ) {
        std::
        vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
        ::operator[]((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                      *)&in_RDI[0xb].
                         super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                         ._M_impl.super__Vector_impl_data._M_finish,local_28);
        bVar1 = std::
                vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                ::empty(in_RDI);
        in_stack_ffffffffffffffa7 = false;
        if (!bVar1) {
          std::
          vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
          ::operator[]((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                        *)&in_RDI[0xb].
                           super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                           ._M_impl.super__Vector_impl_data._M_finish,local_28);
          this_00 = std::
                    vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                    ::back((vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                            *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
          in_stack_ffffffffffffffa7 =
               TimeRepresentation<count_time<9,_long>_>::operator>(&this_00->time,&local_18);
        }
        if ((bool)in_stack_ffffffffffffffa7 == false) break;
        std::
        vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
        ::operator[]((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                      *)&in_RDI[0xb].
                         super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                         ._M_impl.super__Vector_impl_data._M_finish,local_28);
        std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>::
        pop_back((vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                  *)0x50bd46);
      }
      pvVar3 = std::
               vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
               ::operator[]((vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                             *)&in_RDI[8].
                                super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                                ._M_impl.super__Vector_impl_data._M_finish,local_28);
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(&local_18,pvVar3);
      if (bVar1) {
        pvVar3 = std::
                 vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                 ::operator[]((vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                               *)&in_RDI[8].
                                  super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,local_28);
        pvVar3->internalTimeCode = local_18.internalTimeCode;
      }
    }
  }
  return;
}

Assistant:

void InputInfo::removeSource(std::string_view sourceName, Time minTime)
{
    inputUnits.clear();
    inputType.clear();
    for (size_t ii = 0; ii < source_info.size(); ++ii) {
        if (source_info[ii].key == sourceName) {
            while ((!data_queues[ii].empty()) && (data_queues[ii].back().time > minTime)) {
                data_queues[ii].pop_back();
            }
            if (minTime < deactivated[ii]) {
                deactivated[ii] = minTime;
            }
        }
        // there could be duplicate sources so we need to do the full loop
    }
}